

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::loadParameters(IMLE<1,_1,_FastLinearExpert> *this,string *fname)

{
  byte bVar1;
  istream *is;
  undefined8 in_RDI;
  nvp<IMLE<1,_1,_FastLinearExpert>::Param> nVar2;
  xml_iarchive ia;
  ifstream ifs;
  Param newParams;
  Param *in_stack_fffffffffffffc28;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffc30;
  uint flags;
  xml_iarchive *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  Param *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  string local_308 [32];
  string local_2e8 [48];
  undefined1 local_2b8 [695];
  byte local_1;
  
  flags = (uint)((ulong)in_RDI >> 0x20);
  Param::Param(in_stack_fffffffffffffc70);
  is = (istream *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_2b8,is,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffc78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc70);
    std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
    message(in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    local_1 = 0;
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive(in_stack_fffffffffffffc50,is,flags);
    nVar2 = boost::serialization::make_nvp<IMLE<1,1,FastLinearExpert>::Param>
                      ((char *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
              ((interface_iarchive<boost::archive::xml_iarchive> *)nVar2.n_,
               (nvp<IMLE<1,_1,_FastLinearExpert>::Param> *)nVar2.v_);
    std::ifstream::close();
    setParameters((IMLE<1,_1,_FastLinearExpert> *)nVar2.n_,nVar2.v_);
    local_1 = 1;
    boost::archive::xml_iarchive::~xml_iarchive((xml_iarchive *)0x2989af);
  }
  std::ifstream::~ifstream(local_2b8);
  Param::~Param((Param *)0x2989f1);
  return (bool)(local_1 & 1);
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}